

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrLDY0xbc(CPU *this)

{
  uint8_t argument;
  
  argument = absolute_x_addr(this);
  LDY(this,argument);
  return 4;
}

Assistant:

int CPU::instrLDY0xbc() {
	LDY(absolute_x_addr());
	return 4;
}